

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationInternallySynchronizedObjectsTests.cpp
# Opt level: O0

ShaderModuleVector * __thiscall
vkt::synchronization::anon_unknown_0::PipelineCacheComputeTestInstance::addShaderModules
          (ShaderModuleVector *__return_storage_ptr__,PipelineCacheComputeTestInstance *this,
          VkDevice *device)

{
  VkDevice device_00;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  DeviceInterface *deviceInterface;
  size_type sVar1;
  ostream *this_00;
  Unique<vk::Handle<(vk::HandleType)14>_> *this_01;
  ProgramCollection<vk::ProgramBinary> *this_02;
  ProgramBinary *binary;
  reference this_03;
  string local_228;
  Move<vk::Handle<(vk::HandleType)14>_> local_208;
  RefData<vk::Handle<(vk::HandleType)14>_> local_1e8;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> local_1c8;
  ostringstream local_1b8 [8];
  ostringstream shaderName;
  int local_40;
  int shaderNdx;
  DeviceInterface *vk;
  VkDevice *device_local;
  PipelineCacheComputeTestInstance *this_local;
  ShaderModuleVector *shaderCompModules;
  
  deviceInterface = Context::getDeviceInterface((this->super_TestInstance).m_context);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::vector(__return_storage_ptr__);
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_shadersExecutions)
  ;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::resize(__return_storage_ptr__,sVar1);
  for (local_40 = 0;
      sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&this->m_shadersExecutions), local_40 < (int)sVar1; local_40 = local_40 + 1
      ) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    this_00 = std::operator<<((ostream *)local_1b8,"compute_");
    std::ostream::operator<<(this_00,local_40);
    this_01 = (Unique<vk::Handle<(vk::HandleType)14>_> *)operator_new(0x20);
    device_00 = *device;
    this_02 = Context::getBinaryCollection((this->super_TestInstance).m_context);
    std::__cxx11::ostringstream::str();
    binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_02,&local_228);
    ::vk::createShaderModule(&local_208,deviceInterface,device_00,binary,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_1e8,(Move *)&local_208);
    data.deleter.m_deviceIface = local_1e8.deleter.m_deviceIface;
    data.object.m_internal = local_1e8.object.m_internal;
    data.deleter.m_device = local_1e8.deleter.m_device;
    data.deleter.m_allocator = local_1e8.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique(this_01,data);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::SharedPtr
              (&local_1c8,this_01);
    this_03 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
              ::operator[](__return_storage_ptr__,(long)local_40);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::operator=
              (this_03,&local_1c8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::~SharedPtr(&local_1c8);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderModuleVector							addShaderModules					(const VkDevice& device)
	{
		const DeviceInterface&	vk	= m_context.getDeviceInterface();
		ShaderModuleVector		shaderCompModules;
		shaderCompModules.resize(m_shadersExecutions.size());
		for (int shaderNdx = 0; shaderNdx <  static_cast<int>(m_shadersExecutions.size()); ++shaderNdx)
		{
			ostringstream shaderName;
			shaderName<<"compute_"<<shaderNdx;
			shaderCompModules[shaderNdx] = SharedPtr<Unique<VkShaderModule> > (new Unique<VkShaderModule>(createShaderModule(vk, device, m_context.getBinaryCollection().get(shaderName.str()), (VkShaderModuleCreateFlags)0)));
		}
		return shaderCompModules;
	}